

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void kratos::resize_var(Expr *expr,uint32_t target_width,Var *var,bool left)

{
  undefined1 local_48 [8];
  shared_ptr<kratos::Var> new_var;
  shared_ptr<kratos::VarCasted> var_casted;
  
  if (var->type_ == ConstValue) {
    var->var_width_ = target_width;
  }
  else {
    Var::cast((Var *)local_48,(VarCastType)var);
    Var::as<kratos::VarCasted>
              ((Var *)&new_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
    VarCasted::set_target_width
              ((VarCasted *)
               new_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               ,target_width);
    (&expr->left)[!left] =
         (Var *)new_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&var_casted);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&new_var);
  }
  return;
}

Assistant:

void resize_var(Expr *expr, uint32_t target_width, Var *var, bool left) {
    if (var->type() == VarType::ConstValue) {
        var->var_width() = target_width;
    } else {
        auto new_var = var->cast(VarCastType::Resize);
        auto var_casted = new_var->as<VarCasted>();
        var_casted->set_target_width(target_width);
        if (left) {
            expr->left = var_casted.get();
        } else {
            expr->right = var_casted.get();
        }
    }
}